

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
cinatra::to_chunked_buffers
          (cinatra *this,vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers,
          string *size_str,string_view chunk_data,bool eof)

{
  size_t sVar1;
  pointer pcVar2;
  iterator iVar3;
  string *str;
  _Up __unsigned_val;
  __integer_to_chars_result_type<unsigned_long> _Var4;
  const_buffer local_40;
  
  if (size_str != (string *)0x0) {
    pcVar2 = (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((pcVar2 == (pointer)&(buffers->
                             super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>
                             )._M_impl.super__Vector_impl_data._M_end_of_storage) ||
       ((buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)0x14)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffers,0x14);
      pcVar2 = (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14;
    *(undefined1 *)((long)&pcVar2[1].data_ + 4) = 0;
    *(undefined1 *)
     ((long)&(buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
             _M_impl.super__Vector_impl_data._M_start[1].data_ + 4) = 0;
    pcVar2 = (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
             _M_impl.super__Vector_impl_data._M_start;
    _Var4 = std::__detail::__to_chars_16<unsigned_long>
                      ((char *)pcVar2,(char *)((long)&pcVar2[1].data_ + 4),(unsigned_long)size_str);
    pcVar2 = (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_40.size_ = (long)_Var4.ptr - (long)pcVar2;
    local_40.data_ = (pointer)0x0;
    if (local_40.size_ != 0) {
      local_40.data_ = pcVar2;
    }
    iVar3._M_current = *(const_buffer **)(this + 8);
    if (iVar3._M_current == *(const_buffer **)(this + 0x10)) {
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
      _M_realloc_insert<asio::const_buffer>
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,iVar3,
                 &local_40);
      iVar3._M_current = *(const_buffer **)(this + 8);
    }
    else {
      (iVar3._M_current)->data_ = local_40.data_;
      (iVar3._M_current)->size_ = local_40.size_;
      iVar3._M_current = (const_buffer *)(*(long *)(this + 8) + 0x10);
      *(const_buffer **)(this + 8) = iVar3._M_current;
    }
    sVar1 = DAT_001bcad0;
    local_40.data_ = CRCF_abi_cxx11_;
    local_40.size_ = DAT_001bcad0;
    if (iVar3._M_current == *(const_buffer **)(this + 0x10)) {
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
      _M_realloc_insert<asio::const_buffer>
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,iVar3,
                 &local_40);
      iVar3._M_current = *(const_buffer **)(this + 8);
    }
    else {
      (iVar3._M_current)->data_ = CRCF_abi_cxx11_;
      (iVar3._M_current)->size_ = sVar1;
      iVar3._M_current = (const_buffer *)(*(long *)(this + 8) + 0x10);
      *(const_buffer **)(this + 8) = iVar3._M_current;
    }
    if (iVar3._M_current == *(const_buffer **)(this + 0x10)) {
      local_40.data_ = (void *)chunk_data._M_len;
      local_40.size_ = (size_t)size_str;
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
      _M_realloc_insert<asio::const_buffer>
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,iVar3,
                 &local_40);
      iVar3._M_current = *(const_buffer **)(this + 8);
    }
    else {
      (iVar3._M_current)->data_ = (void *)chunk_data._M_len;
      (iVar3._M_current)->size_ = (size_t)size_str;
      iVar3._M_current = (const_buffer *)(*(long *)(this + 8) + 0x10);
      *(const_buffer **)(this + 8) = iVar3._M_current;
    }
    sVar1 = DAT_001bcad0;
    local_40.data_ = CRCF_abi_cxx11_;
    local_40.size_ = DAT_001bcad0;
    if (iVar3._M_current == *(const_buffer **)(this + 0x10)) {
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
      _M_realloc_insert<asio::const_buffer>
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,iVar3,
                 &local_40);
    }
    else {
      (iVar3._M_current)->data_ = CRCF_abi_cxx11_;
      (iVar3._M_current)->size_ = sVar1;
      *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
    }
  }
  if ((char)chunk_data._M_str != '\0') {
    local_40.data_ = "0\r\n";
    local_40.size_ = 3;
    iVar3._M_current = *(const_buffer **)(this + 8);
    if (iVar3._M_current == *(const_buffer **)(this + 0x10)) {
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
      _M_realloc_insert<asio::const_buffer>
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,iVar3,
                 &local_40);
      iVar3._M_current = *(const_buffer **)(this + 8);
    }
    else {
      (iVar3._M_current)->data_ = "0\r\n";
      (iVar3._M_current)->size_ = 3;
      iVar3._M_current = (const_buffer *)(*(long *)(this + 8) + 0x10);
      *(const_buffer **)(this + 8) = iVar3._M_current;
    }
    sVar1 = DAT_001bcad0;
    local_40.data_ = CRCF_abi_cxx11_;
    local_40.size_ = DAT_001bcad0;
    if (iVar3._M_current == *(const_buffer **)(this + 0x10)) {
      std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
      _M_realloc_insert<asio::const_buffer>
                ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,iVar3,
                 &local_40);
    }
    else {
      (iVar3._M_current)->data_ = CRCF_abi_cxx11_;
      (iVar3._M_current)->size_ = sVar1;
      *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
    }
  }
  return;
}

Assistant:

inline void to_chunked_buffers(std::vector<asio::const_buffer> &buffers,
                               std::string &size_str,
                               std::string_view chunk_data, bool eof) {
  size_t length = chunk_data.size();
  if (length > 0) {
    // convert bytes transferred count to a hex string.
    detail::resize(size_str, 20);
    auto [ptr, ec] =
        std::to_chars(size_str.data(), size_str.data() + 20, length, 16);
    std::string_view chunk_size{size_str.data(),
                                size_t(std::distance(size_str.data(), ptr))};

    // Construct chunk based on rfc2616 section 3.6.1
    buffers.push_back(asio::buffer(chunk_size));
    buffers.push_back(asio::buffer(CRCF));
    buffers.push_back(asio::buffer(chunk_data, length));
    buffers.push_back(asio::buffer(CRCF));
  }

  // append last-chunk
  if (eof) {
    buffers.push_back(asio::buffer(LAST_CHUNK));
    buffers.push_back(asio::buffer(CRCF));
  }
}